

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O3

void __thiscall Psbt_ParsePsbt_Test::~Psbt_ParsePsbt_Test(Psbt_ParsePsbt_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Psbt, ParsePsbt) {
  for (const auto& data : g_cfd_psbt_testdata) {
    {
      SCOPED_TRACE("hex[" + data.hex + "]");
      try {
        Psbt from_b64(data.base64);
        if (data.error_message.empty()) {
          EXPECT_EQ(data.hex, from_b64.GetData().GetHex());
          EXPECT_EQ(data.base64, from_b64.GetBase64());
        } else {
          EXPECT_STREQ("The current test should generate an error.", data.hex.c_str());
        }
      } catch (const CfdException& except) {
        EXPECT_STREQ(data.error_message.c_str(), except.what());
      }
    }
  }
}